

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

bool __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::revalidate_data(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                  *this,size_type data_size)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool local_58;
  buffer_t<char> local_38;
  
  buffer_t<char>::validate(&(this->buffer_).v2_);
  local_38.begin = (this->buffer_).v2_.begin;
  uVar2 = (long)(this->buffer_).v2_.end - (long)local_38.begin;
  uVar3 = data_size;
  if (uVar2 < data_size) {
    uVar3 = uVar2;
  }
  if (data_size == 0xffffffffffffffff) {
    uVar3 = uVar2;
  }
  if ((ushort *)local_38.begin == (ushort *)0x0) {
    local_38.begin = (pointer_type)0x0;
    local_38.end = (pointer_type)0x0;
  }
  else {
    local_38.end = (pointer_type)((long)local_38.begin + uVar3);
    if (uVar3 != 0) {
      if ((long)uVar3 < 0) {
        std::terminate();
      }
      local_58 = true;
      if ((long)uVar3 < 2) {
        local_38.last = (pointer_type)0x0;
      }
      else {
        uVar2 = (ulong)*(ushort *)local_38.begin;
        puVar1 = (ushort *)local_38.begin;
        if (uVar3 < uVar2 + 2) {
          local_38.last = (pointer_type)0x0;
        }
        else {
          do {
            local_38.last = (pointer_type)puVar1;
            uVar4 = (ulong)((int)uVar2 + 3U & 0x1fffe);
            uVar3 = uVar3 - uVar4;
            if ((long)uVar3 < 2) goto LAB_0010dec8;
            uVar2 = (ulong)*(ushort *)((long)local_38.last + uVar4);
            puVar1 = (ushort *)((long)local_38.last + uVar4);
          } while (uVar2 + 2 <= uVar3);
        }
        local_58 = false;
      }
LAB_0010dec8:
      buffer_t<char>::validate(&local_38);
      goto LAB_0010dee4;
    }
  }
  local_38.last = (pointer_type)0x0;
  buffer_t<char>::validate(&local_38);
  local_58 = true;
LAB_0010dee4:
  if (local_58 == true) {
    flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
    ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
            *)&local_38);
  }
  else {
    local_38.begin = (pointer_type)0x0;
  }
  (this->buffer_).v2_.last = local_38.begin;
  return local_58;
}

Assistant:

[[nodiscard]] bool revalidate_data(size_type data_size = npos) noexcept {
        size_type new_data_size{ total_capacity() };
        if (data_size != npos) {
            new_data_size = std::min(data_size, new_data_size);
        }
        auto[valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, 
                                                                     buff().begin + new_data_size);
        buff().last = valid ? buffer_view.last().get_ptr() : nullptr;

        return valid;
    }